

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.h
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::GeneratorOptions::GetFileNameExtension_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorOptions *this)

{
  pointer pcVar1;
  
  if (this->import_style == kImportClosure) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->extension)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->extension)._M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"_pb.js","");
  }
  return __return_storage_ptr__;
}

Assistant:

string GetFileNameExtension() const {
    return import_style == kImportClosure ? extension : "_pb.js";
  }